

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  int line;
  size_t i;
  uint16_t profile_id;
  CBS profile_ids;
  CBS srtp_mki;
  ushort local_52;
  CBS local_50;
  CBS local_40;
  
  if (contents == (CBS *)0x0) {
LAB_0013ade0:
    bVar4 = true;
  }
  else {
    ssl = (SSL *)hs->ssl;
    iVar1 = SSL_is_dtls((SSL *)ssl);
    if (iVar1 == 0) {
      __assert_fail("SSL_is_dtls(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x696,
                    "bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
    }
    iVar1 = CBS_get_u16_length_prefixed(contents,&local_50);
    if ((((iVar1 != 0) && (iVar1 = CBS_get_u16(&local_50,&local_52), iVar1 != 0)) &&
        (local_50.len == 0)) &&
       ((iVar1 = CBS_get_u8_length_prefixed(contents,&local_40), iVar1 != 0 && (contents->len == 0))
       )) {
      if (local_40.len == 0) {
        sk = (OPENSSL_STACK *)SSL_get_srtp_profiles(ssl);
        sVar2 = OPENSSL_sk_num(sk);
        if (sVar2 != 0) {
          i = 0;
          do {
            pvVar3 = OPENSSL_sk_value(sk,i);
            if (*(ulong *)((long)pvVar3 + 8) == (ulong)local_52) {
              *(void **)(ssl->handshake_func + 0x280) = pvVar3;
              goto LAB_0013ade0;
            }
            i = i + 1;
          } while (sVar2 != i);
        }
        iVar1 = 0x74;
        line = 0x6b1;
      }
      else {
        iVar1 = 0x73;
        line = 0x6a4;
      }
      ERR_put_error(0x10,0,iVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,line);
      *out_alert = '/';
      return false;
    }
    bVar4 = false;
    ERR_put_error(0x10,0,0x74,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x69e);
  }
  return bVar4;
}

Assistant:

static bool ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // The extension consists of a u16-prefixed profile ID list containing a
  // single uint16_t profile ID, then followed by a u8-prefixed srtp_mki field.
  //
  // See https://tools.ietf.org/html/rfc5764#section-4.1.1
  assert(SSL_is_dtls(ssl));
  CBS profile_ids, srtp_mki;
  uint16_t profile_id;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||  //
      !CBS_get_u16(&profile_ids, &profile_id) ||               //
      CBS_len(&profile_ids) != 0 ||                            //
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||      //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }

  if (CBS_len(&srtp_mki) != 0) {
    // Must be no MKI, since we never offer one.
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_MKI_VALUE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Check to see if the server gave us something we support and offered.
  for (const SRTP_PROTECTION_PROFILE *profile : SSL_get_srtp_profiles(ssl)) {
    if (profile->id == profile_id) {
      ssl->s3->srtp_profile = profile;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
  *out_alert = SSL_AD_ILLEGAL_PARAMETER;
  return false;
}